

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# escape_string.cpp
# Opt level: O3

string * __thiscall
libtorrent::base32encode_i2p_abi_cxx11_
          (string *__return_storage_ptr__,libtorrent *this,span<const_char> s)

{
  int iVar1;
  int iVar2;
  long lVar3;
  byte bVar4;
  size_t __n;
  long lVar5;
  array<std::uint8_t,_5> inbuf;
  array<std::uint8_t,_8> outbuf;
  undefined4 local_50;
  byte local_4c;
  byte local_48;
  byte local_47;
  byte local_46;
  byte local_45;
  byte local_44;
  byte local_43;
  byte local_42;
  byte local_41;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_40;
  libtorrent *local_38;
  
  local_40 = &__return_storage_ptr__->field_2;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)local_40;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  if (s.m_ptr != (char *)0x0) {
    local_38 = (libtorrent *)(s.m_ptr + (long)this);
    do {
      iVar1 = (int)local_38 - (int)this;
      iVar2 = 5;
      if (iVar1 < 5) {
        iVar2 = iVar1;
      }
      local_4c = 0;
      local_50 = 0;
      __n = (size_t)iVar2;
      if (iVar1 < 1) {
        local_50._3_1_ = 0;
        local_50._2_1_ = 0;
        local_50._1_1_ = 0;
        bVar4 = 0;
      }
      else {
        memcpy(&local_50,this,__n);
        bVar4 = (byte)local_50;
      }
      local_48 = bVar4 >> 3;
      local_47 = (bVar4 & 7) << 2 | local_50._1_1_ >> 6;
      local_46 = local_50._1_1_ >> 1 & 0x1f;
      local_45 = (local_50._1_1_ & 1) << 4 | local_50._2_1_ >> 4;
      local_44 = local_50._2_1_ * '\x02' & 0x1f | local_50._3_1_ >> 7;
      local_43 = local_50._3_1_ >> 2 & 0x1f;
      local_42 = (local_50._3_1_ & 3) << 3 | local_4c >> 5;
      local_41 = local_4c & 0x1f;
      lVar3 = (long)base32encode_i2p::input_output_mapping.super_array<int,_6UL>._M_elems[__n];
      if (0 < lVar3) {
        lVar5 = 0;
        do {
          ::std::__cxx11::string::push_back((char)__return_storage_ptr__);
          lVar5 = lVar5 + 1;
        } while (lVar3 != lVar5);
      }
      this = this + __n;
    } while (this != local_38);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string base32encode_i2p(span<char const> s)
	{
		static aux::array<char, 32> const base32_table{
		{
			'a', 'b', 'c', 'd', 'e', 'f', 'g', 'h',
			'i', 'j', 'k', 'l', 'm', 'n', 'o', 'p',
			'q', 'r', 's', 't', 'u', 'v', 'w', 'x',
			'y', 'z', '2', '3', '4', '5', '6', '7'
		}};

		static aux::array<int, 6> const input_output_mapping{{{0, 2, 4, 5, 7, 8}}};

		aux::array<std::uint8_t, 5> inbuf;
		aux::array<std::uint8_t, 8> outbuf;

		std::string ret;
		for (auto i = s.begin(); i != s.end();)
		{
			int const available_input = std::min(int(inbuf.size()), int(s.end() - i));

			// clear input buffer
			inbuf.fill(0);

			// read a chunk of input into inbuf
			std::copy(i, i + available_input, inbuf.begin());
			i += available_input;

			// encode inbuf to outbuf
			outbuf[0] = (inbuf[0] & 0xf8) >> 3;
			outbuf[1] = (((inbuf[0] & 0x07) << 2) | ((inbuf[1] & 0xc0) >> 6)) & 0xff;
			outbuf[2] = ((inbuf[1] & 0x3e) >> 1);
			outbuf[3] = (((inbuf[1] & 0x01) << 4) | ((inbuf[2] & 0xf0) >> 4)) & 0xff;
			outbuf[4] = (((inbuf[2] & 0x0f) << 1) | ((inbuf[3] & 0x80) >> 7)) & 0xff;
			outbuf[5] = ((inbuf[3] & 0x7c) >> 2);
			outbuf[6] = (((inbuf[3] & 0x03) << 3) | ((inbuf[4] & 0xe0) >> 5)) & 0xff;
			outbuf[7] = inbuf[4] & 0x1f;

			// write output
			int const num_out = input_output_mapping[available_input];
			for (int j = 0; j < num_out; ++j)
				ret += base32_table[outbuf[j]];
			// i2p does not use padding
		}
		return ret;
	}